

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.hpp
# Opt level: O0

parse_return __thiscall
msgpack::v2::detail::
context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::
start_aggregate<unsigned_int,msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::array_sv,msgpack::v2::detail::context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>>::array_ev>
          (context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
           *this,array_sv *sv,array_ev *ev,char *load_pos,size_t *off)

{
  bool bVar1;
  parse_return pVar2;
  array_sv *in_RSI;
  context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_> *in_RDI;
  long *in_R8;
  parse_return ret_1;
  parse_return ret;
  type_conflict1 size;
  undefined4 in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  array_sv *in_stack_ffffffffffffffa0;
  parse_helper<msgpack::v2::detail::create_object_visitor> *visitor_holder;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  
  v1::detail::load<unsigned_int>
            ((uint *)in_stack_ffffffffffffffa0,
             (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  in_RDI->m_current = in_RDI->m_current + 1;
  if (in_stack_ffffffffffffffcc == 0) {
    bVar1 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::array_sv::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (!bVar1) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return PARSE_STOP_VISITOR;
    }
    bVar1 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::array_ev::operator()((array_ev *)0x1e1f72);
    if (!bVar1) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return PARSE_STOP_VISITOR;
    }
    visitor_holder = (parse_helper<msgpack::v2::detail::create_object_visitor> *)&in_RDI->m_stack;
    context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::holder
              (in_RDI);
    pVar2 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::unpack_stack::consume((unpack_stack *)in_RDI,visitor_holder);
    if (pVar2 != PARSE_CONTINUE) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return pVar2;
    }
  }
  else {
    bVar1 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::array_sv::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    if (!bVar1) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return PARSE_STOP_VISITOR;
    }
    context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::holder
              (in_RDI);
    context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>::
    array_sv::type(in_RSI);
    pVar2 = context<msgpack::v2::detail::parse_helper<msgpack::v2::detail::create_object_visitor>_>
            ::unpack_stack::push
                      ((unpack_stack *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                       ,(parse_helper<msgpack::v2::detail::create_object_visitor> *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (msgpack_container_type)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    if (pVar2 != PARSE_CONTINUE) {
      *in_R8 = (long)in_RDI->m_current - (long)in_RDI->m_start;
      return pVar2;
    }
  }
  in_RDI->m_cs = 0;
  return PARSE_CONTINUE;
}

Assistant:

parse_return start_aggregate(
        StartVisitor const& sv,
        EndVisitor const& ev,
        const char* load_pos,
        std::size_t& off) {
        typename value<T>::type size;
        load<T>(size, load_pos);
        ++m_current;
        if (size == 0) {
            if (!sv(size)) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            if (!ev()) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            parse_return ret = m_stack.consume(holder());
            if (ret != PARSE_CONTINUE) {
                off = static_cast<std::size_t>(m_current - m_start);
                return ret;
            }
        }
        else {
            if (!sv(size)) {
                off = static_cast<std::size_t>(m_current - m_start);
                return PARSE_STOP_VISITOR;
            }
            parse_return ret = m_stack.push(holder(), sv.type(), static_cast<uint32_t>(size));
            if (ret != PARSE_CONTINUE) {
                off = static_cast<std::size_t>(m_current - m_start);
                return ret;
            }
        }
        m_cs = MSGPACK_CS_HEADER;
        return PARSE_CONTINUE;
    }